

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O1

void __thiscall
chrono::ChTimestepperEulerExplIIorder::Advance(ChTimestepperEulerExplIIorder *this,double dt)

{
  ChState *this_00;
  ChStateDelta *this_01;
  ChStateDelta *pCVar1;
  ChVectorDynamic<> *pCVar2;
  double *pdVar3;
  double *pdVar4;
  ChIntegrable *pCVar5;
  ChIntegrable *pCVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  Index size;
  Index index;
  ulong uVar20;
  long lVar21;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  ChState result;
  ChStateDelta local_a0;
  undefined1 local_88 [24];
  double *local_70;
  Index IStack_68;
  ChStateDelta *local_60;
  ChVectorDynamic<> *local_58;
  double *local_50;
  ChStateDelta local_48;
  
  pCVar5 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  this_00 = &(this->super_ChTimestepperIIorder).X;
  this_01 = &(this->super_ChTimestepperIIorder).V;
  pCVar1 = &(this->super_ChTimestepperIIorder).A;
  (*pCVar5->_vptr_ChIntegrable[0x15])(pCVar5,this_00,this_01,pCVar1);
  iVar19 = (*pCVar5->_vptr_ChIntegrable[0x13])(pCVar5);
  ChStateDelta::setZero
            (&this->Dv,(long)iVar19,
             (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable);
  pCVar2 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.L;
  iVar19 = (*pCVar5->_vptr_ChIntegrable[2])(pCVar5);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar19);
  lVar21 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar21 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar21 != 0) {
    memset((pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar21 << 3);
  }
  local_50 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.T;
  (*pCVar5->_vptr_ChIntegrable[0x16])(pCVar5,this_00,this_01);
  (*pCVar5->_vptr_ChIntegrable[0x1a])
            ((this->super_ChTimestepperIIorder).super_ChTimestepper.T,dt,pCVar5,pCVar1,pCVar2,
             this_00,this_01,0,0);
  ChStateDelta::operator*(&local_a0,this_01,dt);
  ChState::ChState((ChState *)local_88,
                   (this->super_ChTimestepperIIorder).X.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                   (this->super_ChTimestepperIIorder).X.integrable);
  pCVar6 = (this->super_ChTimestepperIIorder).X.integrable;
  local_60 = pCVar1;
  local_58 = pCVar2;
  (*pCVar6->_vptr_ChIntegrable[0xb])(pCVar6,local_88,this_00,&local_a0);
  uVar18 = local_88._8_8_;
  uVar17 = local_88._0_8_;
  if ((this->super_ChTimestepperIIorder).X.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_88._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,local_88._8_8_,1)
    ;
  }
  uVar7 = (this->super_ChTimestepperIIorder).X.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (uVar7 == uVar18) {
    pdVar8 = (this_00->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar20 = uVar7 + 7;
    if (-1 < (long)uVar7) {
      uVar20 = uVar7;
    }
    uVar20 = uVar20 & 0xfffffffffffffff8;
    if (7 < (long)uVar7) {
      lVar21 = 0;
      do {
        pdVar9 = (double *)(uVar17 + lVar21 * 8);
        dVar10 = pdVar9[1];
        dVar11 = pdVar9[2];
        dVar12 = pdVar9[3];
        dVar13 = pdVar9[4];
        dVar14 = pdVar9[5];
        dVar15 = pdVar9[6];
        dVar16 = pdVar9[7];
        pdVar3 = pdVar8 + lVar21;
        *pdVar3 = *pdVar9;
        pdVar3[1] = dVar10;
        pdVar3[2] = dVar11;
        pdVar3[3] = dVar12;
        pdVar3[4] = dVar13;
        pdVar3[5] = dVar14;
        pdVar3[6] = dVar15;
        pdVar3[7] = dVar16;
        lVar21 = lVar21 + 8;
      } while (lVar21 < (long)uVar20);
    }
    if ((long)uVar20 < (long)uVar7) {
      do {
        pdVar8[uVar20] = *(double *)(uVar17 + uVar20 * 8);
        uVar20 = uVar20 + 1;
      } while (uVar7 != uVar20);
    }
    (this->super_ChTimestepperIIorder).X.integrable = (ChIntegrable *)local_88._16_8_;
    if ((double *)local_88._0_8_ != (double *)0x0) {
      free(*(void **)(local_88._0_8_ + -8));
    }
    pCVar1 = local_60;
    if (local_a0.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_a0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [-1]);
    }
    ChStateDelta::operator*(&local_48,pCVar1,dt);
    local_70 = (double *)0x0;
    IStack_68 = 0;
    local_88._0_8_ =
         local_48.super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_88._8_8_ =
         local_48.super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (local_48.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
        local_48.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                   );
    }
    ChStateDelta::operator+(&local_a0,this_01,(ChVectorConstRef)local_88);
    pdVar8 = local_a0.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if ((this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        local_a0.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,
                 local_a0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1);
    }
    pCVar2 = local_58;
    uVar7 = (this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (uVar7 == local_a0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar9 = (this_01->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar20 = uVar7 + 7;
      if (-1 < (long)uVar7) {
        uVar20 = uVar7;
      }
      uVar20 = uVar20 & 0xfffffffffffffff8;
      if (7 < (long)uVar7) {
        lVar21 = 0;
        do {
          pdVar3 = pdVar8 + lVar21;
          dVar10 = pdVar3[1];
          dVar11 = pdVar3[2];
          dVar12 = pdVar3[3];
          dVar13 = pdVar3[4];
          dVar14 = pdVar3[5];
          dVar15 = pdVar3[6];
          dVar16 = pdVar3[7];
          pdVar4 = pdVar9 + lVar21;
          *pdVar4 = *pdVar3;
          pdVar4[1] = dVar10;
          pdVar4[2] = dVar11;
          pdVar4[3] = dVar12;
          pdVar4[4] = dVar13;
          pdVar4[5] = dVar14;
          pdVar4[6] = dVar15;
          pdVar4[7] = dVar16;
          lVar21 = lVar21 + 8;
        } while (lVar21 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar7) {
        do {
          pdVar9[uVar20] = pdVar8[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar7 != uVar20);
      }
      (this->super_ChTimestepperIIorder).V.integrable = local_a0.integrable;
      if (local_a0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_a0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      pCVar1 = local_60;
      if (local_70 != (double *)0x0) {
        free((void *)local_70[-1]);
      }
      if (local_48.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_48.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      *local_50 = dt + *local_50;
      (*pCVar5->_vptr_ChIntegrable[0x17])(pCVar5,this_00,this_01,1);
      (*pCVar5->_vptr_ChIntegrable[0x19])(pCVar5,pCVar1);
      (*pCVar5->_vptr_ChIntegrable[9])(pCVar5,pCVar2);
      return;
    }
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChTimestepperEulerExplIIorder::Advance(const double dt) {
    // downcast
    ChIntegrableIIorder* mintegrable = (ChIntegrableIIorder*)this->integrable;

    // setup main vectors
    mintegrable->StateSetup(X, V, A);

    // setup auxiliary vectors
    Dv.setZero(mintegrable->GetNcoords_v(), GetIntegrable());
    L.setZero(mintegrable->GetNconstr());

    mintegrable->StateGather(X, V, T);  // state <- system

    mintegrable->StateSolveA(A, L, X, V, T, dt, false, false);  // Dv/dt = f(x,v,T)

    // Euler formula!

    X = X + V * dt;  // x_new= x + v * dt

    V = V + A * dt;  // v_new= v + a * dt

    T += dt;

    mintegrable->StateScatter(X, V, T, true);  // state -> system
    mintegrable->StateScatterAcceleration(A);  // -> system auxiliary data
    mintegrable->StateScatterReactions(L);     // -> system auxiliary data
}